

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O3

char * zt_opt_verror_str(int code,char *fmt,__va_list_tag *ap)

{
  char *pcVar1;
  char *user_message;
  char *final;
  char *local_38;
  char *local_30;
  char *local_28;
  
  local_30 = (char *)0x0;
  local_38 = (char *)0x0;
  local_28 = (char *)0x0;
  if (code == 0) {
    pcVar1 = "";
  }
  else {
    pcVar1 = strerror(code);
  }
  asprintf(&local_30,"error: { code: %d, string: \"%s",code,pcVar1);
  pcVar1 = (char *)0x0;
  if (fmt != (char *)0x0) {
    vasprintf(&local_38,fmt,ap);
    pcVar1 = local_38;
  }
  asprintf(&local_28,"%s: %s\" }",local_30,pcVar1);
  if (local_38 != (char *)0x0) {
    free(local_38);
    local_38 = (char *)0x0;
  }
  if (local_30 != (char *)0x0) {
    free(local_30);
  }
  return local_28;
}

Assistant:

char *
zt_opt_verror_str(int code, char * fmt, va_list ap) {
    char * msg          = NULL;
    char * user_message = NULL;
    char * final        = NULL;
    int    len          = 0;

    len = asprintf(&msg, "error: { code: %d, string: \"%s", code, code ? strerror(code) : "");
    if (fmt) {
        len += vasprintf(&user_message, fmt, ap);
    }
    len += asprintf(&final, "%s: %s\" }", msg, user_message);

    zt_free(user_message);
    zt_free(msg);
    return final;
}